

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O2

QDBusMenuItemList * __thiscall
QDBusMenuAdaptor::GetGroupProperties
          (QDBusMenuItemList *__return_storage_ptr__,QDBusMenuAdaptor *this,QList<int> *ids,
          QStringList *propertyNames)

{
  int **debug;
  qsizetype *debug_00;
  QDBusMenuItem **debug_01;
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QDBusMenuItem> QStack_98;
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  char *local_68;
  QList<int> local_60;
  QList<QDBusMenuItem> local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_68 = pQVar1->name;
    local_80 = 2;
    local_7c = 0;
    uStack_74 = 0;
    local_6c = 0;
    QMessageLogger::debug();
    debug = &local_60.d.ptr;
    ::operator<<((QDebug)debug,&local_60);
    debug_00 = &local_60.d.size;
    ::operator<<((QDebug)debug_00,(QList<QString> *)debug);
    pQVar2 = QDebug::operator<<((QDebug *)debug_00,"=>");
    local_48.d.d = (Data *)pQVar2->stream;
    ((Stream *)local_48.d.d)->ref = ((Stream *)local_48.d.d)->ref + 1;
    QDBusMenuItem::items((QDBusMenuItemList *)&QStack_98,ids,propertyNames);
    debug_01 = &local_48.d.ptr;
    ::operator<<((QDebug)debug_01,&local_48);
    QDebug::~QDebug((QDebug *)debug_01);
    QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer(&QStack_98);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug((QDebug *)&local_60.d.size);
    QDebug::~QDebug((QDebug *)&local_60.d.ptr);
    QDebug::~QDebug((QDebug *)&local_60);
  }
  QDBusMenuItem::items(__return_storage_ptr__,ids,propertyNames);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMenuItemList QDBusMenuAdaptor::GetGroupProperties(const QList<int> &ids, const QStringList &propertyNames)
{
    qCDebug(qLcMenu) << ids << propertyNames << "=>" << QDBusMenuItem::items(ids, propertyNames);
    return QDBusMenuItem::items(ids, propertyNames);
}